

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O3

void __thiscall NavierStokesBase::computeGradP(NavierStokesBase *this,Real time)

{
  MultiFab *sol;
  MultiFab *grad;
  initializer_list<amrex::Geometry> __l;
  initializer_list<amrex::BoxArray> __l_00;
  initializer_list<amrex::DistributionMapping> __l_01;
  initializer_list<const_amrex::FabFactory<amrex::FArrayBox>_*> __l_02;
  MLNodeLaplacian linop;
  allocator_type local_834;
  allocator_type local_833;
  allocator_type local_832;
  allocator_type local_831;
  Real local_830;
  DistributionMapping local_828;
  vector<const_amrex::FabFactory<amrex::FArrayBox>_*,_std::allocator<const_amrex::FabFactory<amrex::FArrayBox>_*>_>
  local_818;
  vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> local_800;
  LPInfo local_7e8;
  vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> local_7c8;
  vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> local_7b0;
  _Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false> local_798;
  BoxArray local_790;
  Geometry local_728;
  MLNodeLaplacian local_660;
  
  local_7e8.do_agglomeration = true;
  local_7e8.do_consolidation = true;
  local_7e8.do_semicoarsening = false;
  local_7e8.agg_grid_size = -1;
  local_7e8.con_grid_size = -1;
  local_7e8.has_metric_term = true;
  local_7e8.max_coarsening_level = 0;
  local_7e8.max_semicoarsening_level = 0;
  local_7e8.semicoarsening_direction = -1;
  local_7e8.hidden_direction = -1;
  local_830 = time;
  memcpy(&local_728,&(this->super_AmrLevel).geom,200);
  __l._M_len = 1;
  __l._M_array = &local_728;
  std::vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::vector(&local_800,__l,&local_831);
  amrex::BoxArray::BoxArray(&local_790,&(this->super_AmrLevel).grids);
  __l_00._M_len = 1;
  __l_00._M_array = &local_790;
  std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::vector
            (&local_7b0,__l_00,&local_832);
  local_828.m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (this->super_AmrLevel).dmap.m_ref.
           super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_828.m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (this->super_AmrLevel).dmap.m_ref.
       super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if (local_828.m_ref.
      super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_828.m_ref.
       super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_828.m_ref.
            super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_828.m_ref.
       super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_828.m_ref.
            super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  __l_01._M_len = 1;
  __l_01._M_array = &local_828;
  std::vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::vector
            (&local_7c8,__l_01,&local_833);
  local_798._M_head_impl =
       (this->super_AmrLevel).m_factory._M_t.
       super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
       .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl;
  __l_02._M_len = 1;
  __l_02._M_array = &local_798._M_head_impl;
  std::
  vector<const_amrex::FabFactory<amrex::FArrayBox>_*,_std::allocator<const_amrex::FabFactory<amrex::FArrayBox>_*>_>
  ::vector(&local_818,__l_02,&local_834);
  amrex::MLNodeLaplacian::MLNodeLaplacian
            (&local_660,(Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)&local_800,
             (Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)&local_7b0,
             (Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
             &local_7c8,&local_7e8,
             (Vector<const_amrex::FabFactory<amrex::FArrayBox>_*,_std::allocator<const_amrex::FabFactory<amrex::FArrayBox>_*>_>
              *)&local_818,0.0);
  if (local_818.
      super__Vector_base<const_amrex::FabFactory<amrex::FArrayBox>_*,_std::allocator<const_amrex::FabFactory<amrex::FArrayBox>_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_818.
                    super__Vector_base<const_amrex::FabFactory<amrex::FArrayBox>_*,_std::allocator<const_amrex::FabFactory<amrex::FArrayBox>_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_818.
                          super__Vector_base<const_amrex::FabFactory<amrex::FArrayBox>_*,_std::allocator<const_amrex::FabFactory<amrex::FArrayBox>_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_818.
                          super__Vector_base<const_amrex::FabFactory<amrex::FArrayBox>_*,_std::allocator<const_amrex::FabFactory<amrex::FArrayBox>_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::~vector
            (&local_7c8);
  if (local_828.m_ref.
      super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_828.m_ref.
               super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::~vector(&local_7b0);
  amrex::BoxArray::~BoxArray(&local_790);
  if (local_800.super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_800.super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_800.
                          super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_800.
                          super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  amrex::MLNodeLaplacian::buildIntegral(&local_660);
  sol = amrex::AmrLevel::get_data(&this->super_AmrLevel,1,local_830);
  grad = amrex::AmrLevel::get_data(&this->super_AmrLevel,2,local_830);
  amrex::MLNodeLaplacian::compGrad(&local_660,0,grad,sol);
  amrex::AmrLevel::FillPatch
            (&this->super_AmrLevel,grad,
             (grad->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0],local_830,2,
             0,3,0);
  amrex::MLNodeLaplacian::~MLNodeLaplacian(&local_660);
  return;
}

Assistant:

void
NavierStokesBase::computeGradP(Real time)
{
    LPInfo info;
    info.setMaxCoarseningLevel(0);
    MLNodeLaplacian linop({geom}, {grids}, {dmap}, info, {&Factory()});
#ifdef AMREX_USE_EB
    linop.buildIntegral();
#endif

    // No call to set BCs because we're only calling compGrad(), which
    // doesn't use them. P already exists on surroundingNodes(Gp.validbox()),
    // and compGrad() does not fill ghost cells

    MultiFab& Press = get_data(Press_Type, time);
    MultiFab& Gp    = get_data(Gradp_Type, time);

    linop.compGrad(0, Gp, Press);

    // Now fill ghost cells
    FillPatch(*this,Gp,Gp.nGrow(),time,Gradp_Type,0,AMREX_SPACEDIM);
}